

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O0

void __thiscall
BVSparseNode<Memory::JitArenaAllocator>::BVSparseNode
          (BVSparseNode<Memory::JitArenaAllocator> *this,BVIndex beginIndex,
          BVSparseNode<Memory::JitArenaAllocator> *nextNode)

{
  BVSparseNode<Memory::JitArenaAllocator> *nextNode_local;
  BVIndex beginIndex_local;
  BVSparseNode<Memory::JitArenaAllocator> *this_local;
  
  this->next = nextNode;
  this->startIndex = beginIndex;
  BVUnitT<unsigned_long>::BVUnitT(&this->data,0);
  return;
}

Assistant:

BVSparseNode<TAllocator>::BVSparseNode(BVIndex beginIndex, BVSparseNode<TAllocator> * nextNode) :
    startIndex(beginIndex),
    data(0),
    next(nextNode)
{
    // Performance assert, BVSparseNode is heavily used in the backend, do perf
    // measurement before changing this.
#if defined(TARGET_64)
    CompileAssert(sizeof(BVSparseNode) == 24);
#else
    CompileAssert(sizeof(BVSparseNode) == 16);
#endif
}